

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-data-getter-setters.c
# Opt level: O0

char * uv_req_type_name(uv_req_type type)

{
  char *pcStack_10;
  uv_req_type type_local;
  
  switch(type) {
  case UV_UNKNOWN_REQ:
  case UV_REQ_TYPE_MAX:
  default:
    pcStack_10 = (char *)0x0;
    break;
  case UV_REQ:
    pcStack_10 = "req";
    break;
  case UV_CONNECT:
    pcStack_10 = "connect";
    break;
  case UV_WRITE:
    pcStack_10 = "write";
    break;
  case UV_SHUTDOWN:
    pcStack_10 = "shutdown";
    break;
  case UV_UDP_SEND:
    pcStack_10 = "udp_send";
    break;
  case UV_FS:
    pcStack_10 = "fs";
    break;
  case UV_WORK:
    pcStack_10 = "work";
    break;
  case UV_GETADDRINFO:
    pcStack_10 = "getaddrinfo";
    break;
  case UV_GETNAMEINFO:
    pcStack_10 = "getnameinfo";
    break;
  case UV_RANDOM:
    pcStack_10 = "random";
  }
  return pcStack_10;
}

Assistant:

const char* uv_req_type_name(uv_req_type type) {
  switch (type) {
#define XX(uc,lc) case UV_##uc: return #lc;
  UV_REQ_TYPE_MAP(XX)
#undef XX
  case UV_REQ_TYPE_MAX:
  case UV_UNKNOWN_REQ:
  default: /* UV_REQ_TYPE_PRIVATE */
    break;
  }
  return NULL;
}